

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

bool __thiscall Lowerer::GenerateFastRealStackArgumentsLdLen(Lowerer *this,Instr *ldLen)

{
  bool bVar1;
  IntConstOpnd *src;
  Instr *this_00;
  Opnd *pOVar2;
  RegOpnd *src_00;
  RegOpnd *actualCountOpnd;
  Instr *loadInputParamCountInstr;
  Instr *ldLen_local;
  Lowerer *this_local;
  
  bVar1 = Func::IsInlinee(ldLen->m_func);
  if (bVar1) {
    pOVar2 = IR::Instr::GetDst(ldLen);
    src = IR::IntConstOpnd::New
                    ((long)(int)(ldLen->m_func->actualCount - 1),TyUint32,ldLen->m_func,false);
    InsertMove(pOVar2,&src->super_Opnd,ldLen,true);
  }
  else {
    this_00 = LowererMD::LoadInputParamCount(&this->m_lowererMD,ldLen,-1,false);
    pOVar2 = IR::Instr::GetDst(this_00);
    src_00 = IR::Opnd::AsRegOpnd(pOVar2);
    pOVar2 = IR::Instr::GetDst(ldLen);
    InsertMove(pOVar2,&src_00->super_Opnd,ldLen,true);
  }
  IR::Instr::Remove(ldLen);
  return false;
}

Assistant:

bool
Lowerer::GenerateFastRealStackArgumentsLdLen(IR::Instr *ldLen)
{
    if(ldLen->m_func->IsInlinee())
    {
        //Get the length of the arguments
        Lowerer::InsertMove(ldLen->GetDst(),
                               IR::IntConstOpnd::New(ldLen->m_func->actualCount - 1, TyUint32, ldLen->m_func),
                               ldLen);
    }
    else
    {
        IR::Instr *loadInputParamCountInstr = this->m_lowererMD.LoadInputParamCount(ldLen, -1);
        IR::RegOpnd *actualCountOpnd = loadInputParamCountInstr->GetDst()->AsRegOpnd();
        Lowerer::InsertMove(ldLen->GetDst(), actualCountOpnd, ldLen);
    }
    ldLen->Remove();
    return false;
}